

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_> __thiscall
cmMakefileTargetGenerator::New(cmMakefileTargetGenerator *this,cmGeneratorTarget *tgt)

{
  TargetType TVar1;
  cmMakefileLibraryTargetGenerator *this_00;
  pointer *__ptr;
  
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator = (_func_int **)0x0;
  TVar1 = cmGeneratorTarget::GetType(tgt);
  switch(TVar1) {
  case EXECUTABLE:
    this_00 = (cmMakefileLibraryTargetGenerator *)operator_new(0x408);
    cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
              ((cmMakefileExecutableTargetGenerator *)this_00,tgt);
    break;
  case STATIC_LIBRARY:
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
  case OBJECT_LIBRARY:
    this_00 = (cmMakefileLibraryTargetGenerator *)operator_new(0x428);
    cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator(this_00,tgt);
    break;
  case UTILITY:
  case INTERFACE_LIBRARY:
    this_00 = (cmMakefileLibraryTargetGenerator *)operator_new(1000);
    cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
              ((cmMakefileUtilityTargetGenerator *)this_00,tgt);
    break;
  default:
    goto switchD_00409811_caseD_6;
  }
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator = (_func_int **)this_00;
switchD_00409811_caseD_6:
  return (__uniq_ptr_data<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>,_true,_true>
          )(__uniq_ptr_data<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmMakefileTargetGenerator> cmMakefileTargetGenerator::New(
  cmGeneratorTarget* tgt)
{
  std::unique_ptr<cmMakefileTargetGenerator> result;

  switch (tgt->GetType()) {
    case cmStateEnums::EXECUTABLE:
      result = cm::make_unique<cmMakefileExecutableTargetGenerator>(tgt);
      break;
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      result = cm::make_unique<cmMakefileLibraryTargetGenerator>(tgt);
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UTILITY:
      result = cm::make_unique<cmMakefileUtilityTargetGenerator>(tgt);
      break;
    default:
      return result;
      // break; /* unreachable */
  }
  return result;
}